

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDPValueIteration.cpp
# Opt level: O1

void __thiscall MDPValueIteration::PlanWithCache(MDPValueIteration *this,bool computeIfNotCached)

{
  ostream *poVar1;
  string filenameCache;
  stringstream ss;
  string local_1f0;
  string local_1d0;
  stringstream local_1b0 [16];
  ostream local_1a0 [112];
  ios_base local_130 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b0);
  local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"GMAA","");
  directories::MADPGetResultsDir
            (&local_1f0,&local_1d0,(PlanningUnit *)(this->super_MDPSolver)._m_pu);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_1a0,local_1f0._M_dataplus._M_p,local_1f0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"/MDPQtable",10);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
  }
  if (this->_m_finiteHorizon == true) {
    std::__ostream_insert<char,std::char_traits<char>>(local_1a0,"_h",2);
    std::ostream::_M_insert<unsigned_long>((ulong)local_1a0);
  }
  std::__cxx11::stringbuf::str();
  (*(this->super_MDPSolver)._vptr_MDPSolver[4])(this,&local_1f0,(ulong)computeIfNotCached);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringstream::~stringstream(local_1b0);
  std::ios_base::~ios_base(local_130);
  return;
}

Assistant:

void MDPValueIteration::PlanWithCache(bool computeIfNotCached)
{
    stringstream ss;
    ss << directories::MADPGetResultsDir("GMAA",GetPU()) << "/MDPQtable";
    if(_m_finiteHorizon)
        ss << "_h" << GetPU()->GetHorizon();
    string filenameCache=ss.str();

    PlanWithCache(filenameCache,computeIfNotCached);
}